

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O1

void __thiscall
boost::numeric::ublas::
sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
::get_d(sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
        *this)

{
  container_type *pcVar1;
  ulong uVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pcVar1 = (this->
           super_container_reference<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ).c_;
  uVar2 = this->i_;
  p_Var3 = &(pcVar1->data_).
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = *(_Base_ptr *)
            ((long)&(pcVar1->data_).
                    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var4 = &p_Var3->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2]) {
    if (*(ulong *)(p_Var5 + 1) >= uVar2) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var3) && (p_Var5 = p_Var4, uVar2 < *(ulong *)(p_Var4 + 1))) {
    p_Var5 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var3) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = p_Var5[1]._M_parent;
  }
  this->d_ = (value_type)p_Var5;
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        container_type &operator () () const {
           return *c_;
        }